

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvDiurnal_kry.c
# Opt level: O2

int main(void)

{
  int iVar1;
  int iVar2;
  void *returnvalue;
  undefined8 uVar3;
  double *pdVar4;
  void *returnvalue_00;
  void *pvVar5;
  undefined8 *puVar6;
  double *pdVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int jx;
  bool bVar11;
  double dVar12;
  double dVar13;
  int retval;
  int retval_1;
  undefined4 uStack_ec;
  SUNContext sunctx;
  int qu;
  undefined4 uStack_dc;
  sunrealtype hu;
  double local_d0;
  void *local_c8;
  long nst;
  void *local_b8;
  sunrealtype local_b0;
  long local_a8;
  void *local_a0;
  sunrealtype t;
  long ncfl;
  long nps;
  long nli;
  long netf;
  long ncfn;
  long nni;
  long nsetups;
  long nfe;
  long nst_1;
  undefined4 local_44;
  long nfeLS;
  long npe;
  
  retval = SUNContext_Create(0,&sunctx);
  iVar2 = 1;
  iVar1 = check_retval(&retval,"SUNContext_Create",1);
  if (iVar1 == 0) {
    returnvalue = (void *)N_VNew_Serial(200,sunctx);
    iVar1 = check_retval(returnvalue,"N_VNew_Serial",0);
    if (iVar1 == 0) {
      local_c8 = malloc(0x998);
      lVar8 = (long)local_c8 + 0x640;
      local_a8 = lVar8;
      for (lVar9 = 0; pvVar5 = local_c8, lVar9 != 10; lVar9 = lVar9 + 1) {
        for (lVar10 = 0; lVar10 != 10; lVar10 = lVar10 + 1) {
          uVar3 = SUNDlsMat_newDenseMat(2,2);
          *(undefined8 *)(lVar8 + -0x640 + lVar10 * 8) = uVar3;
          uVar3 = SUNDlsMat_newDenseMat(2,2);
          *(undefined8 *)(lVar8 + -800 + lVar10 * 8) = uVar3;
          uVar3 = SUNDlsMat_newIndexArray(2);
          *(undefined8 *)(lVar8 + lVar10 * 8) = uVar3;
        }
        lVar8 = lVar8 + 0x50;
      }
      iVar1 = check_retval(local_c8,"AllocUserData",2);
      if (iVar1 == 0) {
        *(undefined8 *)((long)pvVar5 + 0x968) = 0x3f13104b57cf96af;
        *(undefined8 *)((long)pvVar5 + 0x970) = 0x4001c71c71c71c72;
        *(undefined8 *)((long)pvVar5 + 0x978) = 0x4001c71c71c71c72;
        *(undefined8 *)((long)pvVar5 + 0x980) = 0x3eab2dd8d6457178;
        *(undefined4 *)((long)pvVar5 + 0x988) = 0x487fcb92;
        *(undefined4 *)((long)pvVar5 + 0x98c) = 0x3f2d7dbf;
        *(undefined4 *)((long)pvVar5 + 0x990) = 0xa7da8610;
        *(undefined4 *)((long)pvVar5 + 0x994) = 0x3e216505;
        pdVar4 = (double *)N_VGetArrayPointer(returnvalue);
        for (lVar8 = 0; lVar8 != 10; lVar8 = lVar8 + 1) {
          dVar12 = ((double)(int)lVar8 * 2.2222222222222223 + 30.0 + -40.0) * 0.1;
          dVar12 = dVar12 * dVar12;
          dVar12 = dVar12 * dVar12 * 0.5 + (1.0 - dVar12);
          pdVar7 = pdVar4;
          for (lVar9 = 0; lVar9 != 10; lVar9 = lVar9 + 1) {
            dVar13 = ((double)(int)lVar9 * 2.2222222222222223 + 0.0 + -10.0) * 0.1;
            dVar13 = dVar13 * dVar13;
            dVar13 = dVar13 * dVar13 * 0.5 + (1.0 - dVar13);
            *pdVar7 = dVar13 * 1000000.0 * dVar12;
            pdVar7[1] = dVar13 * 1000000000000.0 * dVar12;
            pdVar7 = pdVar7 + 2;
          }
          pdVar4 = pdVar4 + 0x14;
        }
        returnvalue_00 = (void *)CVodeCreate(2,sunctx);
        local_a0 = returnvalue_00;
        iVar1 = check_retval(returnvalue_00,"CVodeCreate",0);
        if (iVar1 == 0) {
          retval = CVodeSetUserData(returnvalue_00,pvVar5);
          iVar2 = 1;
          iVar1 = check_retval(&retval,"CVodeSetUserData",1);
          if (iVar1 == 0) {
            retval = CVodeInit(0,returnvalue_00,f,returnvalue);
            iVar2 = 1;
            iVar1 = check_retval(&retval,"CVodeInit",1);
            if (iVar1 == 0) {
              retval = CVodeSStolerances(0x88e368f1,0x3f50624dd2f1a9fc,returnvalue_00);
              iVar2 = 1;
              iVar1 = check_retval(&retval,"CVodeSStolerances",1);
              if (iVar1 == 0) {
                iVar2 = 1;
                pvVar5 = (void *)SUNLinSol_SPGMR(returnvalue,1,0,sunctx);
                iVar1 = check_retval(pvVar5,"SUNLinSol_SPGMR",0);
                if (iVar1 == 0) {
                  retval = CVodeSetLinearSolver(returnvalue_00,pvVar5,0);
                  iVar2 = 1;
                  iVar1 = check_retval(&retval,"CVodeSetLinearSolver",1);
                  if (iVar1 == 0) {
                    retval = CVodeSetJacTimes(returnvalue_00,0,jtv);
                    iVar2 = 1;
                    iVar1 = check_retval(&retval,"CVodeSetJacTimes",1);
                    if (iVar1 == 0) {
                      retval = CVodeSetPreconditioner(returnvalue_00,Precond,PSolve);
                      iVar2 = 1;
                      iVar1 = check_retval(&retval,"CVodeSetPreconditioner",1);
                      if (iVar1 == 0) {
                        local_b8 = pvVar5;
                        puts(" \n2-species diurnal advection-diffusion problem\n");
                        dVar12 = 7200.0;
                        iVar1 = 0xc;
                        while( true ) {
                          bVar11 = iVar1 == 0;
                          iVar1 = iVar1 + -1;
                          if (bVar11) break;
                          local_d0 = dVar12;
                          retval = CVode(SUB84(dVar12,0),returnvalue_00,returnvalue,&t,1);
                          local_b0 = t;
                          puVar6 = (undefined8 *)N_VGetArrayPointer(returnvalue);
                          retval_1 = CVodeGetNumSteps(returnvalue_00,&nst);
                          check_retval(&retval_1,"CVodeGetNumSteps",1);
                          retval_1 = CVodeGetLastOrder(returnvalue_00,&qu);
                          check_retval(&retval_1,"CVodeGetLastOrder",1);
                          retval_1 = CVodeGetLastStep(returnvalue_00,&hu);
                          check_retval(&retval_1,"CVodeGetLastStep",1);
                          printf("t = %.2e   no. steps = %ld   order = %d   stepsize = %.2e\n",
                                 SUB84(local_b0,0),hu,nst,(ulong)(uint)qu);
                          printf("c1 (bot.left/middle/top rt.) = %12.3e  %12.3e  %12.3e\n",
                                 (int)*puVar6,puVar6[0x58],puVar6[0xc6]);
                          printf("c2 (bot.left/middle/top rt.) = %12.3e  %12.3e  %12.3e\n\n",
                                 (int)puVar6[1],puVar6[0x59],puVar6[199]);
                          iVar2 = check_retval(&retval,"CVode",1);
                          if (iVar2 != 0) break;
                          dVar12 = local_d0 + 7200.0;
                        }
                        local_44 = CVodeGetWorkSpace(returnvalue_00,&nst,&hu);
                        check_retval(&local_44,"CVodeGetWorkSpace",1);
                        local_44 = CVodeGetNumSteps(returnvalue_00,&nst_1);
                        check_retval(&local_44,"CVodeGetNumSteps",1);
                        local_44 = CVodeGetNumRhsEvals(returnvalue_00,&nfe);
                        check_retval(&local_44,"CVodeGetNumRhsEvals",1);
                        local_44 = CVodeGetNumLinSolvSetups(returnvalue_00,&nsetups);
                        check_retval(&local_44,"CVodeGetNumLinSolvSetups",1);
                        local_44 = CVodeGetNumErrTestFails(returnvalue_00,&netf);
                        check_retval(&local_44,"CVodeGetNumErrTestFails",1);
                        local_44 = CVodeGetNumNonlinSolvIters(returnvalue_00,&nni);
                        check_retval(&local_44,"CVodeGetNumNonlinSolvIters",1);
                        local_44 = CVodeGetNumNonlinSolvConvFails(returnvalue_00,&ncfn);
                        check_retval(&local_44,"CVodeGetNumNonlinSolvConvFails",1);
                        local_44 = CVodeGetLinWorkSpace(returnvalue_00,&qu,&retval_1);
                        check_retval(&local_44,"CVodeGetLinWorkSpace",1);
                        local_44 = CVodeGetNumLinIters(returnvalue_00,&nli);
                        check_retval(&local_44,"CVodeGetNumLinIters",1);
                        local_44 = CVodeGetNumPrecEvals(returnvalue_00,&npe);
                        check_retval(&local_44,"CVodeGetNumPrecEvals",1);
                        local_44 = CVodeGetNumPrecSolves(returnvalue_00,&nps);
                        check_retval(&local_44,"CVodeGetNumPrecSolves",1);
                        local_44 = CVodeGetNumLinConvFails(returnvalue_00,&ncfl);
                        check_retval(&local_44,"CVodeGetNumLinConvFails",1);
                        local_44 = CVodeGetNumLinRhsEvals(returnvalue_00);
                        check_retval(&local_44,"CVodeGetNumLinRhsEvals",1);
                        puts("\nFinal Statistics.. \n");
                        printf("lenrw   = %5ld     leniw   = %5ld\n",nst,hu);
                        printf("lenrwLS = %5ld     leniwLS = %5ld\n",CONCAT44(uStack_dc,qu),
                               CONCAT44(uStack_ec,retval_1));
                        printf("nst     = %5ld\n",nst_1);
                        printf("nfe     = %5ld     nfeLS   = %5ld\n",nfe,nfeLS);
                        printf("nni     = %5ld     nli     = %5ld\n",nni,nli);
                        printf("nsetups = %5ld     netf    = %5ld\n",nsetups,netf);
                        printf("npe     = %5ld     nps     = %5ld\n",npe,nps);
                        printf("ncfn    = %5ld     ncfl    = %5ld\n\n",ncfn,ncfl);
                        N_VDestroy(returnvalue);
                        lVar8 = local_a8;
                        for (lVar9 = 0; lVar9 != 10; lVar9 = lVar9 + 1) {
                          for (lVar10 = 0; lVar10 != 10; lVar10 = lVar10 + 1) {
                            SUNDlsMat_destroyMat(*(undefined8 *)(lVar8 + -0x640 + lVar10 * 8));
                            SUNDlsMat_destroyMat(*(undefined8 *)(lVar8 + -800 + lVar10 * 8));
                            SUNDlsMat_destroyArray(*(undefined8 *)(lVar8 + lVar10 * 8));
                          }
                          lVar8 = lVar8 + 0x50;
                        }
                        free(local_c8);
                        CVodeFree(&local_a0);
                        SUNLinSolFree(local_b8);
                        SUNContext_Free(&sunctx);
                        iVar2 = 0;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int main(void)
{
  SUNContext sunctx;
  sunrealtype abstol, reltol, t, tout;
  N_Vector u;
  UserData data;
  SUNLinearSolver LS;
  void* cvode_mem;
  int iout, retval;

  u         = NULL;
  data      = NULL;
  LS        = NULL;
  cvode_mem = NULL;

  /* Create the SUNDIALS context */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Allocate memory, and set problem data, initial values, tolerances */
  u = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)u, "N_VNew_Serial", 0)) { return (1); }
  data = AllocUserData();
  if (check_retval((void*)data, "AllocUserData", 2)) { return (1); }
  InitUserData(data);
  SetInitialProfiles(u, data->dx, data->dy);
  abstol = ATOL;
  reltol = RTOL;

  /* Call CVodeCreate to create the solver memory and specify the
   * Backward Differentiation Formula */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Set the pointer to user-defined data */
  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Call CVodeInit to initialize the integrator memory and specify the
   * user's right hand side function in u'=f(t,u), the initial time T0, and
   * the initial dependent variable vector u. */
  retval = CVodeInit(cvode_mem, f, T0, u);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Call CVodeSStolerances to specify the scalar relative tolerance
   * and scalar absolute tolerances */
  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Call SUNLinSol_SPGMR to specify the linear solver SPGMR
   * with left preconditioning and the default Krylov dimension */
  LS = SUNLinSol_SPGMR(u, SUN_PREC_LEFT, 0, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_SPGMR", 0)) { return (1); }

  /* Call CVodeSetLinearSolver to attach the linear solver to CVode */
  retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

  /* set the JAcobian-times-vector function */
  retval = CVodeSetJacTimes(cvode_mem, NULL, jtv);
  if (check_retval(&retval, "CVodeSetJacTimes", 1)) { return (1); }

  /* Set the preconditioner solve and setup functions */
  retval = CVodeSetPreconditioner(cvode_mem, Precond, PSolve);
  if (check_retval(&retval, "CVodeSetPreconditioner", 1)) { return (1); }

  /* In loop over output points, call CVode, print results, test for error */
  printf(" \n2-species diurnal advection-diffusion problem\n\n");
  for (iout = 1, tout = TWOHR; iout <= NOUT; iout++, tout += TWOHR)
  {
    retval = CVode(cvode_mem, tout, u, &t, CV_NORMAL);
    PrintOutput(cvode_mem, u, t);
    if (check_retval(&retval, "CVode", 1)) { break; }
  }

  PrintFinalStats(cvode_mem);

  /* Free memory */
  N_VDestroy(u);
  FreeUserData(data);
  CVodeFree(&cvode_mem);
  SUNLinSolFree(LS);
  SUNContext_Free(&sunctx);

  return (0);
}